

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

iterator __thiscall
llvm::SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>::
insert(SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
       *this,iterator I,unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *Elt)

{
  long lVar1;
  long *plVar2;
  DWARFUnit *pDVar3;
  DWARFUnit *pDVar4;
  uint uVar5;
  ulong uVar6;
  iterator puVar7;
  long lVar8;
  long *plVar9;
  
  puVar7 = (iterator)
           (this->
           super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
           ).
           super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
           .super_SmallVectorBase.BeginX;
  uVar5 = (this->
          super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
          ).
          super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
          .super_SmallVectorBase.Size;
  uVar6 = (ulong)uVar5;
  if (puVar7 + uVar6 == I) {
    SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
    ::push_back(&this->
                 super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
                ,Elt);
    I = (iterator)
        ((long)(this->
               super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
               ).
               super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
               .super_SmallVectorBase.BeginX +
        (ulong)(this->
               super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
               ).
               super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
               .super_SmallVectorBase.Size * 8 + -8);
  }
  else {
    if (I < puVar7) {
      __assert_fail("I >= this->begin() && \"Insertion iterator is out of bounds.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                    ,0x1d9,
                    "iterator llvm::SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit>>::insert(iterator, T &&) [T = std::unique_ptr<llvm::DWARFUnit>]"
                   );
    }
    if (puVar7 + uVar6 < I) {
      __assert_fail("I <= this->end() && \"Inserting past the end of the vector.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                    ,0x1da,
                    "iterator llvm::SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit>>::insert(iterator, T &&) [T = std::unique_ptr<llvm::DWARFUnit>]"
                   );
    }
    if ((this->
        super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
        ).
        super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
        .super_SmallVectorBase.Capacity <= uVar5) {
      lVar8 = (long)I - (long)puVar7;
      SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
      ::grow(&this->
              super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
             ,0);
      puVar7 = (iterator)
               (this->
               super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
               ).
               super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
               .super_SmallVectorBase.BeginX;
      I = (iterator)(lVar8 + (long)puVar7);
      uVar6 = (ulong)(this->
                     super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
                     ).
                     super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
                     .super_SmallVectorBase.Size;
    }
    uVar5 = (uint)uVar6;
    if (uVar5 == 0) {
      __assert_fail("!empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                    ,0xa7,
                    "reference llvm::SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit>>::back() [T = std::unique_ptr<llvm::DWARFUnit>]"
                   );
    }
    puVar7[uVar6]._M_t.super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>
    ._M_t.super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
    super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl =
         puVar7[uVar6 - 1]._M_t.
         super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>._M_t.
         super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
         super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl;
    puVar7[uVar6 - 1]._M_t.
    super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>._M_t.
    super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
    super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl = (DWARFUnit *)0x0;
    plVar9 = (long *)((long)(this->
                            super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
                            ).
                            super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
                            .super_SmallVectorBase.BeginX + uVar6 * 8 + -8);
    lVar8 = (long)plVar9 - (long)I >> 3;
    if (0 < lVar8) {
      lVar8 = lVar8 + 1;
      do {
        lVar1 = plVar9[-1];
        plVar2 = (long *)*plVar9;
        plVar9[-1] = 0;
        *plVar9 = lVar1;
        if (plVar2 != (long *)0x0) {
          (**(code **)(*plVar2 + 8))();
        }
        plVar9 = plVar9 + -1;
        lVar8 = lVar8 + -1;
      } while (1 < lVar8);
      uVar5 = (this->
              super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
              ).
              super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
              .super_SmallVectorBase.Size;
    }
    if ((this->
        super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
        ).
        super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
        .super_SmallVectorBase.Capacity <= uVar5) {
      __assert_fail("N <= capacity()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                    ,0x43,"void llvm::SmallVectorBase::set_size(size_t)");
    }
    (this->
    super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
    ).
    super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
    .super_SmallVectorBase.Size = uVar5 + 1;
    lVar8 = 0;
    if (I <= Elt) {
      lVar8 = (ulong)(Elt < (unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *)
                            ((long)(this->
                                   super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
                                   ).
                                   super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
                                   .super_SmallVectorBase.BeginX + (ulong)uVar5 * 8 + 8)) << 3;
    }
    pDVar3 = *(DWARFUnit **)
              ((long)&(Elt->_M_t).
                      super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>
                      .super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl + lVar8);
    *(undefined8 *)
     ((long)&(Elt->_M_t).
             super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>._M_t.
             super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
             super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl + lVar8) = 0;
    pDVar4 = (I->_M_t).super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>
             ._M_t.super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
             super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl;
    (I->_M_t).super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>._M_t.
    super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
    super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl = pDVar3;
    if (pDVar4 != (DWARFUnit *)0x0) {
      (*pDVar4->_vptr_DWARFUnit[1])();
    }
  }
  return I;
}

Assistant:

iterator insert(iterator I, T &&Elt) {
    if (I == this->end()) {  // Important special case for empty vector.
      this->push_back(::std::move(Elt));
      return this->end()-1;
    }

    assert(I >= this->begin() && "Insertion iterator is out of bounds.");
    assert(I <= this->end() && "Inserting past the end of the vector.");

    if (this->size() >= this->capacity()) {
      size_t EltNo = I-this->begin();
      this->grow();
      I = this->begin()+EltNo;
    }

    ::new ((void*) this->end()) T(::std::move(this->back()));
    // Push everything else over.
    std::move_backward(I, this->end()-1, this->end());
    this->set_size(this->size() + 1);

    // If we just moved the element we're inserting, be sure to update
    // the reference.
    T *EltPtr = &Elt;
    if (I <= EltPtr && EltPtr < this->end())
      ++EltPtr;

    *I = ::std::move(*EltPtr);
    return I;
  }